

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O1

lys_module * ly_ctx_load_module(ly_ctx *ctx,char *name,char *revision,char **features)

{
  lys_glob_unres *unres;
  LY_ERR LVar1;
  char *pcVar2;
  lys_module *mod;
  lys_module *local_20;
  
  local_20 = (lys_module *)0x0;
  if (ctx == (ly_ctx *)0x0) {
    pcVar2 = "ctx";
    ctx = (ly_ctx *)0x0;
  }
  else {
    if (name != (char *)0x0) {
      unres = &ctx->unres;
      LVar1 = lys_parse_load(ctx,name,revision,&(ctx->unres).creating,&local_20);
      if ((LVar1 == LY_SUCCESS) &&
         (LVar1 = _lys_set_implemented(local_20,features,unres), LVar1 == LY_SUCCESS)) {
        if ((ctx->flags & 0x80) != 0) {
          return local_20;
        }
        LVar1 = lys_unres_dep_sets_create(ctx,&unres->dep_sets,local_20);
        if ((LVar1 == LY_SUCCESS) &&
           (LVar1 = lys_compile_depset_all(ctx,unres), LVar1 == LY_SUCCESS)) {
          lys_unres_glob_erase(unres);
          return local_20;
        }
      }
      lys_unres_glob_revert(ctx,unres);
      lys_unres_glob_erase(unres);
      return (lys_module *)0x0;
    }
    pcVar2 = "name";
  }
  ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar2,"ly_ctx_load_module");
  return (lys_module *)0x0;
}

Assistant:

lys_module *
ly_ctx_load_module(struct ly_ctx *ctx, const char *name, const char *revision, const char **features)
{
    struct lys_module *mod = NULL;
    LY_ERR ret = LY_SUCCESS;

    LY_CHECK_ARG_RET(ctx, ctx, name, NULL);

    /* load and parse */
    ret = lys_parse_load(ctx, name, revision, &ctx->unres.creating, &mod);
    LY_CHECK_GOTO(ret, cleanup);

    /* implement */
    ret = _lys_set_implemented(mod, features, &ctx->unres);
    LY_CHECK_GOTO(ret, cleanup);

    if (!(ctx->flags & LY_CTX_EXPLICIT_COMPILE)) {
        /* create dep set for the module and mark all the modules that will be (re)compiled */
        LY_CHECK_GOTO(ret = lys_unres_dep_sets_create(ctx, &ctx->unres.dep_sets, mod), cleanup);

        /* (re)compile the whole dep set (other dep sets will have no modules marked for compilation) */
        LY_CHECK_GOTO(ret = lys_compile_depset_all(ctx, &ctx->unres), cleanup);

        /* unres resolved */
        lys_unres_glob_erase(&ctx->unres);
    }

cleanup:
    if (ret) {
        lys_unres_glob_revert(ctx, &ctx->unres);
        lys_unres_glob_erase(&ctx->unres);
        mod = NULL;
    }
    return mod;
}